

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fifo_path_posix.cpp
# Opt level: O2

server_pipe __thiscall pstore::brokerface::fifo_path::open_server_pipe(fifo_path *this)

{
  char *path;
  value_type vVar1;
  value_type vVar2;
  value_type r;
  __mode_t __mask;
  int iVar3;
  int *piVar4;
  _Head_base<0UL,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>,_false>
  extraout_RDX;
  pthread_mutex_t *in_RSI;
  server_pipe sVar5;
  pipe_descriptor fdwrite;
  pipe_descriptor fdread;
  
  path = *(char **)((long)in_RSI + 0x30);
  std::mutex::lock((mutex *)&in_RSI->__data);
  anon_unknown.dwarf_118673::open_fifo((anon_unknown_dwarf_118673 *)&fdread,path,0);
  if (fdread.fd_ < 0) {
    __mask = umask(0);
    iVar3 = mkfifo(path,0x11b6);
    umask(__mask);
    if (iVar3 == 0) {
      LOCK();
      in_RSI[1].__size[0] = '\x01';
      UNLOCK();
      anon_unknown.dwarf_118673::open_fifo((anon_unknown_dwarf_118673 *)&fdwrite,path,0);
      details::descriptor<pstore::details::posix_descriptor_traits>::operator=(&fdread,&fdwrite);
      details::descriptor<pstore::details::posix_descriptor_traits>::~descriptor(&fdwrite);
      if (-1 < fdread.fd_) goto LAB_0011bf9d;
    }
    piVar4 = __errno_location();
    anon_unknown.dwarf_118673::raise_cannot_create_fifo(path,*piVar4);
  }
LAB_0011bf9d:
  anon_unknown.dwarf_118673::open_fifo((anon_unknown_dwarf_118673 *)&fdwrite,path,1);
  vVar2 = fdread.fd_;
  vVar1 = fdwrite.fd_;
  if (-1 < fdwrite.fd_) {
    fdwrite.fd_ = -1;
    (this->open_server_pipe_mut_).super___mutex_base._M_mutex.__data.__lock = vVar1;
    fdread.fd_ = -1;
    (this->open_server_pipe_mut_).super___mutex_base._M_mutex.__data.__owner = vVar2;
    details::descriptor<pstore::details::posix_descriptor_traits>::~descriptor(&fdwrite);
    details::descriptor<pstore::details::posix_descriptor_traits>::~descriptor(&fdread);
    pthread_mutex_unlock(in_RSI);
    sVar5.fd_.
    super__Tuple_impl<0UL,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
    .
    super__Head_base<0UL,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>,_false>
    ._M_head_impl = extraout_RDX._M_head_impl;
    sVar5.fd_.
    super__Tuple_impl<0UL,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
    .super__Tuple_impl<1UL,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>.
    super__Head_base<1UL,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>,_false>
    ._M_head_impl =
         (_Head_base<1UL,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>,_false>
          )(_Head_base<1UL,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>,_false>
            )this;
    return (server_pipe)
           sVar5.fd_.
           super__Tuple_impl<0UL,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
    ;
  }
  piVar4 = __errno_location();
  anon_unknown.dwarf_118673::raise_cannot_create_fifo(path,*piVar4);
}

Assistant:

auto fifo_path::open_server_pipe () -> server_pipe {
            auto * const path = path_.c_str ();
            std::lock_guard<decltype (open_server_pipe_mut_)> //! OCLINT
                const lock{open_server_pipe_mut_};

            // The server opens its well-known FIFO read-only (since it only reads from it) each
            // time the number of clients goes from 1 to 0, the server will read an end of file on
            // the FIFO. To prevent the server from having to handle this case, we use the trick of
            // just having the server open its well-known FIFO for read–write. Unfortunately,
            // POSIX.1 specifically states that opening a FIFO for read–write is undefined. Although
            // most UNIX systems allow this, we use two open() calls instead.

            pipe_descriptor fdread = open_fifo (path, O_RDONLY);
            if (fdread.native_handle () < 0) {
                // If the file open failed, we create the FIFO and try again.
                constexpr mode_t mode =
                    S_IFIFO | S_IRUSR | S_IWUSR | S_IRGRP | S_IWGRP | S_IROTH | S_IWOTH;
                if (make_fifo (path, mode) != 0) {
                    raise_cannot_create_fifo (path, errno);
                }

                needs_delete_ = true;

                fdread = open_fifo (path, O_RDONLY);
                if (fdread.native_handle () < 0) {
                    // Open failed for a second time. Give up.
                    raise_cannot_create_fifo (path, errno);
                }
            }

            pipe_descriptor fdwrite = open_fifo (path, O_WRONLY);
            if (fdwrite.native_handle () < 0) {
                raise_cannot_create_fifo (path, errno);
            }

            return {std::move (fdread), std::move (fdwrite)};
        }